

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O2

void __thiscall
flatbuffers::php::PhpGenerator::GetMemberOfVectorOfNonStruct
          (PhpGenerator *this,FieldDef *field,string *code_ptr)

{
  Value *value;
  size_t sVar1;
  Type *type;
  Type *type_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  Type local_68;
  string local_48;
  
  local_68.base_type = (field->value).type.element;
  local_68.fixed_length = (field->value).type.fixed_length;
  local_68.element = BASE_TYPE_NONE;
  local_68.struct_def = (field->value).type.struct_def;
  local_68.enum_def = (field->value).type.enum_def;
  std::operator+(&bStack_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_e8);
  std::operator+(&bStack_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," * @param int offset\n");
  std::__cxx11::string::append((string *)code_ptr);
  value = &field->value;
  std::__cxx11::string::~string((string *)&bStack_e8);
  std::operator+(&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," * @return ");
  GenTypeGet_abi_cxx11_(&local_88,(PhpGenerator *)value,type);
  std::operator+(&local_c8,&local_a8,&local_88);
  std::operator+(&bStack_e8,&local_c8,"\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::operator+(&bStack_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_," */\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_e8);
  std::operator+(&bStack_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"public function get");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_e8);
  ConvertCase(&bStack_e8,(string *)field,kUpperCamel,kSnake);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_e8);
  std::__cxx11::string::append((char *)code_ptr);
  std::operator+(&bStack_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_e8);
  std::operator+(&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_);
  std::operator+(&local_a8,&local_88,"$o = $this->__offset(");
  NumToString<unsigned_short>(&local_48,(field->value).offset);
  std::operator+(&local_c8,&local_a8,&local_48);
  std::operator+(&bStack_e8,&local_c8,");\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  if ((field->value).type.element == BASE_TYPE_STRING) {
    std::operator+(&bStack_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_e8);
    std::__cxx11::string::append((char *)code_ptr);
    sVar1 = InlineSize(&local_68);
    NumToString<unsigned_long>(&local_c8,sVar1);
    std::operator+(&bStack_e8,&local_c8,") : ");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    GenDefaultValue_abi_cxx11_(&local_c8,this,value);
    std::operator+(&bStack_e8,&local_c8,";\n");
    std::__cxx11::string::append((string *)code_ptr);
  }
  else {
    std::operator+(&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &Indent_abi_cxx11_);
    std::operator+(&bStack_e8,&local_c8,"return $o != 0 ? $this->bb->get");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    GenTypeGet_abi_cxx11_(&local_c8,(PhpGenerator *)value,type_00);
    ConvertCase(&bStack_e8,&local_c8,kUpperCamel,kSnake);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::append((char *)code_ptr);
    sVar1 = InlineSize(&local_68);
    NumToString<unsigned_long>(&local_c8,sVar1);
    std::operator+(&bStack_e8,&local_c8,") : ");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&bStack_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    GenDefaultValue_abi_cxx11_(&local_c8,this,value);
    std::operator+(&bStack_e8,&local_c8,";\n");
    std::__cxx11::string::append((string *)code_ptr);
  }
  std::__cxx11::string::~string((string *)&bStack_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::operator+(&bStack_e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&bStack_e8);
  return;
}

Assistant:

void GetMemberOfVectorOfNonStruct(const FieldDef &field,
                                    std::string *code_ptr) {
    std::string &code = *code_ptr;
    auto vectortype = field.value.type.VectorType();

    code += Indent + "/**\n";
    code += Indent + " * @param int offset\n";
    code += Indent + " * @return " + GenTypeGet(field.value.type) + "\n";
    code += Indent + " */\n";
    code += Indent + "public function get";
    code += ConvertCase(field.name, Case::kUpperCamel);
    code += "($j)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$o = $this->__offset(" +
            NumToString(field.value.offset) + ");\n";

    if (IsString(field.value.type.VectorType())) {
      code += Indent + Indent;
      code += "return $o != 0 ? $this->__string($this->__vector($o) + $j * ";
      code += NumToString(InlineSize(vectortype)) + ") : ";
      code += GenDefaultValue(field.value) + ";\n";
    } else {
      code += Indent + Indent + "return $o != 0 ? $this->bb->get";
      code += ConvertCase(GenTypeGet(field.value.type), Case::kUpperCamel);
      code += "($this->__vector($o) + $j * ";
      code += NumToString(InlineSize(vectortype)) + ") : ";
      code += GenDefaultValue(field.value) + ";\n";
    }
    code += Indent + "}\n\n";
  }